

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template-parser.c
# Opt level: O2

void blogc_template_free_ast(bc_slist_t *ast)

{
  void *__ptr;
  bc_slist_t *tmp;
  _bc_slist_t *p_Var1;
  
  for (p_Var1 = ast; p_Var1 != (bc_slist_t *)0x0; p_Var1 = p_Var1->next) {
    __ptr = p_Var1->data;
    if (__ptr != (void *)0x0) {
      free(*(void **)((long)__ptr + 8));
      free(*(void **)((long)__ptr + 0x10));
      free(__ptr);
    }
  }
  bc_slist_free(ast);
  return;
}

Assistant:

void
blogc_template_free_ast(bc_slist_t *ast)
{
    for (bc_slist_t *tmp = ast; tmp != NULL; tmp = tmp->next) {
        blogc_template_node_t *data = tmp->data;
        if (data == NULL)
            continue;
        free(data->data[0]);
        free(data->data[1]);
        free(data);
    }
    bc_slist_free(ast);
}